

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  Descriptor *pDVar1;
  int __c;
  int __c_00;
  Descriptor *in_RSI;
  char *pcVar2;
  EnumDescriptor *in_RDI;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  char local_1c [4];
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  pDVar1 = containing_type(in_RDI);
  if (pDVar1 == (Descriptor *)0x0) {
    local_1c[0] = '\x05';
    local_1c[1] = '\0';
    local_1c[2] = '\0';
    local_1c[3] = '\0';
    pcVar2 = local_1c;
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    index(in_RDI,pcVar2,__c_00);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type_conflict2 *)in_RSI);
  }
  else {
    containing_type(in_RDI);
    Descriptor::GetLocationPath
              (in_RSI,(vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    pcVar2 = &stack0xffffffffffffffec;
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    index(in_RDI,pcVar2,__c);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RSI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}